

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  ushort uVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  ushort *puVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  ushort *local_48;
  char *local_40;
  char *local_38;
  
  pcVar9 = dest + originalSize;
  local_48 = (ushort *)source;
  local_40 = source;
  local_38 = dest;
  while( true ) {
    puVar5 = (ushort *)((long)local_48 + 1);
    uVar1 = *local_48;
    uVar6 = (uint)(byte)((byte)uVar1 >> 4);
    uVar7 = (ulong)uVar6;
    local_48 = puVar5;
    if (uVar6 == 0xf) {
      sVar2 = read_long_length_no_check((BYTE **)&local_48);
      uVar7 = sVar2 + 0xf;
    }
    puVar5 = local_48;
    if ((ulong)((long)pcVar9 - (long)dest) < uVar7) {
      return -1;
    }
    memmove(dest,local_48,uVar7);
    pcVar8 = dest + uVar7;
    puVar5 = (ushort *)((long)puVar5 + uVar7);
    if ((ulong)((long)pcVar9 - (long)pcVar8) < 0xc) {
      if (pcVar8 == pcVar9) {
        return (int)puVar5 - (int)local_40;
      }
      return -1;
    }
    uVar7 = (ulong)((byte)uVar1 & 0xf);
    uVar1 = *puVar5;
    local_48 = puVar5 + 1;
    if (uVar7 == 0xf) {
      sVar2 = read_long_length_no_check((BYTE **)&local_48);
      uVar7 = sVar2 + 0xf;
    }
    uVar7 = uVar7 + 4;
    if ((ulong)((long)pcVar9 - (long)pcVar8) < uVar7) break;
    if ((ulong)((long)pcVar8 - (long)local_38) < (ulong)uVar1) {
      return -1;
    }
    pcVar3 = pcVar8;
    uVar4 = uVar7;
    while (bVar10 = uVar4 != 0, uVar4 = uVar4 - 1, bVar10) {
      *pcVar3 = pcVar3[-(ulong)uVar1];
      pcVar3 = pcVar3 + 1;
    }
    dest = pcVar8 + uVar7;
    if ((ulong)((long)pcVar9 - (long)dest) < 5) {
      return -1;
    }
  }
  return -1;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    DEBUGLOG(5, "LZ4_decompress_fast");
    return LZ4_decompress_unsafe_generic(
                (const BYTE*)source, (BYTE*)dest, originalSize,
                0, NULL, 0);
}